

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
gss::innards::HomomorphismSearcher::solution_in_proof_form_abi_cxx11_
          (vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  uint v;
  pointer pHVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer pHVar4;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  NamedVertex local_80;
  NamedVertex local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar4 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar4 != pHVar1) {
    do {
      ppVar2 = (__return_storage_ptr__->
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (__return_storage_ptr__->
               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      v = (pHVar4->assignment).pattern_vertex;
      lVar7 = (long)ppVar2 - (long)ppVar3;
      lVar6 = (lVar7 >> 4) * -0x3333333333333333 >> 2;
      if (0 < lVar6) {
        lVar7 = lVar6 + 1;
        ppVar5 = ppVar3 + 2;
        do {
          if (ppVar5[-2].first.first == v) {
            ppVar5 = ppVar5 + -2;
            goto LAB_0013166f;
          }
          if (ppVar5[-1].first.first == v) {
            ppVar5 = ppVar5 + -1;
            goto LAB_0013166f;
          }
          if ((ppVar5->first).first == v) goto LAB_0013166f;
          if (ppVar5[1].first.first == v) {
            ppVar5 = ppVar5 + 1;
            goto LAB_0013166f;
          }
          lVar7 = lVar7 + -1;
          ppVar5 = ppVar5 + 4;
        } while (1 < lVar7);
        lVar7 = (long)ppVar2 - (long)(ppVar3 + lVar6 * 4);
        ppVar3 = ppVar3 + lVar6 * 4;
      }
      lVar6 = (lVar7 >> 4) * -0x3333333333333333;
      if (lVar6 == 1) {
LAB_00131651:
        ppVar5 = ppVar3;
        if ((ppVar3->first).first != v) {
          ppVar5 = ppVar2;
        }
LAB_0013166f:
        if (ppVar2 == ppVar5) goto LAB_00131674;
      }
      else {
        if (lVar6 == 2) {
LAB_00131649:
          ppVar5 = ppVar3;
          if ((ppVar3->first).first != v) {
            ppVar3 = ppVar3 + 1;
            goto LAB_00131651;
          }
          goto LAB_0013166f;
        }
        if (lVar6 == 3) {
          ppVar5 = ppVar3;
          if ((ppVar3->first).first != v) {
            ppVar3 = ppVar3 + 1;
            goto LAB_00131649;
          }
          goto LAB_0013166f;
        }
LAB_00131674:
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(&local_80,this->model,v);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  (&local_58,this->model,(pHVar4->assignment).target_vertex);
        std::
        vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>
                  ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                    *)__return_storage_ptr__,&local_80,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
          operator_delete(local_58.second._M_dataplus._M_p,
                          local_58.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
          operator_delete(local_80.second._M_dataplus._M_p,
                          local_80.second.field_2._M_allocated_capacity + 1);
        }
      }
      pHVar4 = pHVar4 + 1;
    } while (pHVar4 != pHVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto HomomorphismSearcher::solution_in_proof_form(const HomomorphismAssignments & assignments) const -> vector<pair<NamedVertex, NamedVertex>>
{
    vector<pair<NamedVertex, NamedVertex>> solution;
    for (auto & a : assignments.values)
        if (solution.end() == find_if(solution.begin(), solution.end(), [&](const auto & t) { return unsigned(t.first.first) == a.assignment.pattern_vertex; }))
            solution.emplace_back(
                model.pattern_vertex_for_proof(a.assignment.pattern_vertex),
                model.target_vertex_for_proof(a.assignment.target_vertex));
    return solution;
}